

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O1

void hashword2(uint32_t *k,size_t length,uint32_t *pc,uint32_t *pb)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  uVar1 = *pc + (int)length * 4 + 0xdeadbeef;
  uVar3 = uVar1;
  uVar4 = uVar1;
  if (3 < length) {
    do {
      uVar1 = uVar1 + k[2];
      uVar4 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar4 + *k) - uVar1;
      iVar2 = uVar1 + uVar3 + k[1];
      uVar1 = (uVar4 << 6 | uVar4 >> 0x1a) ^ (uVar3 + k[1]) - uVar4;
      iVar5 = uVar4 + iVar2;
      uVar3 = (uVar1 << 8 | uVar1 >> 0x18) ^ iVar2 - uVar1;
      iVar6 = uVar1 + iVar5;
      uVar4 = (uVar3 << 0x10 | uVar3 >> 0x10) ^ iVar5 - uVar3;
      iVar2 = uVar3 + iVar6;
      uVar3 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar6 - uVar4;
      uVar4 = uVar4 + iVar2;
      uVar1 = (uVar3 << 4 | uVar3 >> 0x1c) ^ iVar2 - uVar3;
      uVar3 = uVar3 + uVar4;
      length = length - 3;
      k = k + 3;
    } while (3 < length);
  }
  (*(code *)(&DAT_0013c5ac + *(int *)(&DAT_0013c5ac + length * 4)))
            (k,&DAT_0013c5ac + *(int *)(&DAT_0013c5ac + length * 4),pc,pb,uVar3,uVar4);
  return;
}

Assistant:

void hashword2(
const uint32_t *k,                   /* the key, an array of uint32_t values */
size_t          length,               /* the length of the key, in uint32_ts */
uint32_t        *pc,
uint32_t        *pb)         /* the previous hash, or an arbitrary value */
{
  uint32_t a,b,c;

  /* Set up the internal state */
  a = b = c = 0xdeadbeef + (((uint32_t)length)<<2) + *pc;

  /*------------------------------------------------- handle most of the key */
  while (length > 3)
  {
    a += k[0];
    b += k[1];
    c += k[2];
    mix(a,b,c);
    length -= 3;
    k += 3;
  }

  /*------------------------------------------- handle the last 3 uint32_t's */
  switch(length)                     /* all the case statements fall through */
  { 
  case 3 : c+=k[2];
  case 2 : b+=k[1];
  case 1 : a+=k[0];
    final(a,b,c);
  case 0:     /* case 0: nothing left to add */
    break;
  }
  /*------------------------------------------------------ report the result */
  *pc = c;
  *pb = b;
}